

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RowidConstraint(Parse *pParse,int onError,Table *pTab)

{
  int local_2c;
  char *pcStack_28;
  int rc;
  char *zMsg;
  Table *pTab_local;
  int onError_local;
  Parse *pParse_local;
  
  if (pTab->iPKey < 0) {
    pcStack_28 = sqlite3MPrintf(pParse->db,"%s.rowid",pTab->zName);
    local_2c = 0xa13;
  }
  else {
    pcStack_28 = sqlite3MPrintf(pParse->db,"%s.%s",pTab->zName,pTab->aCol[pTab->iPKey].zCnName);
    local_2c = 0x613;
  }
  sqlite3HaltConstraint(pParse,local_2c,onError,pcStack_28,-6,'\x02');
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RowidConstraint(
  Parse *pParse,    /* Parsing context */
  int onError,      /* Conflict resolution algorithm */
  Table *pTab       /* The table with the non-unique rowid */
){
  char *zMsg;
  int rc;
  if( pTab->iPKey>=0 ){
    zMsg = sqlite3MPrintf(pParse->db, "%s.%s", pTab->zName,
                          pTab->aCol[pTab->iPKey].zCnName);
    rc = SQLITE_CONSTRAINT_PRIMARYKEY;
  }else{
    zMsg = sqlite3MPrintf(pParse->db, "%s.rowid", pTab->zName);
    rc = SQLITE_CONSTRAINT_ROWID;
  }
  sqlite3HaltConstraint(pParse, rc, onError, zMsg, P4_DYNAMIC,
                        P5_ConstraintUnique);
}